

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_errmsg(sqlite3 *db)

{
  u32 uVar1;
  uint uVar2;
  char *pcVar3;
  
  if (db == (sqlite3 *)0x0) {
    pcVar3 = "out of memory";
  }
  else {
    uVar1 = db->magic;
    if (((uVar1 == 0xa029a697) || (uVar1 == 0xf03b7906)) || (uVar1 == 0x4b771290)) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (db->mallocFailed == '\0') {
        pcVar3 = (char *)sqlite3ValueText(db->pErr,'\x01');
        if (pcVar3 == (char *)0x0) {
          uVar2 = db->errCode;
          if (uVar2 == 0x204) {
            pcVar3 = "abort due to ROLLBACK";
          }
          else if (uVar2 == 0x65) {
            pcVar3 = "no more rows available";
          }
          else if (uVar2 == 100) {
            pcVar3 = "another row available";
          }
          else {
            pcVar3 = "unknown error";
            if (((uVar2 & 0xff) < 0x1d) && ((0x1410004UL >> ((ulong)(byte)uVar2 & 0x3f) & 1) == 0))
            {
              pcVar3 = *(char **)(sqlite3ErrStr_aMsg + (ulong)(byte)uVar2 * 8);
            }
          }
        }
      }
      else {
        pcVar3 = "out of memory";
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
    }
    else {
      sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x25df3,
                  "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
      pcVar3 = "bad parameter or other API misuse";
    }
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }else{
    testcase( db->pErr==0 );
    z = (char*)sqlite3_value_text(db->pErr);
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}